

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

bool __thiscall cmCTestMultiProcessHandler::AllResourcesAvailable(cmCTestMultiProcessHandler *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>_>_>_>
  *pmVar1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  
  pmVar1 = cmCTestResourceAllocator::GetResources_abi_cxx11_(&this->ResourceAllocator);
  p_Var4 = &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var3 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var4; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    for (p_Var2 = p_Var3[2]._M_right; p_Var2 != (_Rb_tree_node_base *)&p_Var3[2]._M_parent;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      if (*(int *)&p_Var2[2].field_0x4 != 0) goto LAB_0024c661;
    }
  }
LAB_0024c661:
  return (_Rb_tree_header *)p_Var3 == p_Var4;
}

Assistant:

bool cmCTestMultiProcessHandler::AllResourcesAvailable()
{
  for (auto const& it : this->ResourceAllocator.GetResources()) {
    for (auto const& it2 : it.second) {
      if (it2.second.Locked != 0) {
        return false;
      }
    }
  }

  return true;
}